

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

void __thiscall
ctemplate::TemporaryRegisterTemplate::TemporaryRegisterTemplate
          (TemporaryRegisterTemplate *this,char *name)

{
  char *pcVar1;
  allocator local_49;
  string local_48 [48];
  char *local_18;
  char *name_local;
  TemporaryRegisterTemplate *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->namelist_);
  this->old_namelist_ = TemplateNamelist::namelist__abi_cxx11_;
  if (this->old_namelist_ != (NameListType *)0x0) {
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->namelist_,this->old_namelist_);
  }
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,&local_49);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->namelist_,(value_type *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  TemplateNamelist::namelist__abi_cxx11_ = &this->namelist_;
  return;
}

Assistant:

TemporaryRegisterTemplate::TemporaryRegisterTemplate(const char* name) {
  old_namelist_ = TemplateNamelist::namelist_;
  if (old_namelist_) {
    namelist_ = *old_namelist_;
  }

  namelist_.insert(name);
  TemplateNamelist::namelist_ = &namelist_;
}